

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

Value * __thiscall ccd::Json::Value::operator[](Value *this,int key)

{
  variant_alternative_t<5UL,_variant<int,_double,_bool,_basic_string<char>,_map<basic_string<char>,_Value,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_Value>_>_>,_vector<Value,_allocator<Value>_>_>_>
  *pvVar1;
  string *psVar2;
  
  if (this->m_type == Array) {
    pvVar1 = std::
             get<5ul,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
                       (&this->m_value);
    return (pvVar1->super__Vector_base<ccd::Json::Value,_std::allocator<ccd::Json::Value>_>)._M_impl
           .super__Vector_impl_data._M_start + key;
  }
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar2,"Item is no Array","");
  __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

const Value& Value::operator[] ( const int key ) const
{
	if ( m_type != Type::Array )
		throw std::string ( "Item is no Array" );
	return std::get<Array>(m_value)[key];
}